

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::small_vector
          (small_vector<unsigned_char,_128UL> *this,small_vector<unsigned_char,_128UL> *rhs)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  uchar *__value;
  back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_> local_30;
  
  memset(this,0,0xa0);
  this->buffer_ = (this->small_buffer_)._M_elems;
  uVar1 = (long)(this->big_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage -
          (long)(this->big_buffer_).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar2 = 0x80;
  if (0x80 < uVar1) {
    uVar2 = uVar1;
  }
  if (uVar2 < rhs->elements_) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&this->big_buffer_,rhs->elements_);
  }
  __value = rhs->buffer_;
  if (0 < (long)rhs->elements_) {
    lVar3 = rhs->elements_ + 1;
    local_30.container = this;
    do {
      std::back_insert_iterator<pstore::small_vector<unsigned_char,_128UL>_>::operator=
                (&local_30,__value);
      __value = __value + 1;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  return;
}

Assistant:

small_vector<ElementType, BodyElements>::small_vector (small_vector const & rhs)
            : small_vector () {
        this->reserve (rhs.size ());
        std::copy (std::begin (rhs), std::end (rhs), std::back_inserter (*this));
    }